

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iostats.cpp
# Opt level: O3

summary<unsigned_int> * __thiscall
foxxll::stats_data::get_read_count_summary
          (summary<unsigned_int> *__return_storage_ptr__,stats_data *this)

{
  pointer pfVar1;
  pointer ppVar2;
  pair<unsigned_int,_unsigned_int> pVar3;
  double dVar4;
  uint *puVar5;
  uint uVar6;
  undefined8 in_RAX;
  ulong uVar7;
  long lVar8;
  uint *puVar9;
  pointer ppVar10;
  uint uVar11;
  ulong uVar12;
  __normal_iterator<std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
  __i;
  pointer ppVar13;
  file_stats_data *f;
  pointer pfVar14;
  uint *puVar15;
  undefined1 auVar16 [16];
  undefined8 local_38;
  
  (__return_storage_ptr__->values_per_device).
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->values_per_device).
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->values_per_device).
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = in_RAX;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::reserve(&__return_storage_ptr__->values_per_device,
            ((long)(this->file_stats_data_list_).
                   super__Vector_base<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->file_stats_data_list_).
                   super__Vector_base<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555);
  pfVar14 = (this->file_stats_data_list_).
            super__Vector_base<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pfVar1 = (this->file_stats_data_list_).
           super__Vector_base<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pfVar14 != pfVar1) {
    do {
      local_38._0_4_ = pfVar14->device_id_;
      local_38._4_4_ = pfVar14->read_count_;
      std::
      vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
      ::emplace_back<unsigned_int,unsigned_int>
                ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                  *)&__return_storage_ptr__->values_per_device,(uint *)((long)&local_38 + 4),
                 (uint *)&local_38);
      pfVar14 = pfVar14 + 1;
    } while (pfVar14 != pfVar1);
  }
  ppVar10 = (__return_storage_ptr__->values_per_device).
            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (__return_storage_ptr__->values_per_device).
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar10 != ppVar2) {
    uVar7 = (long)ppVar2 - (long)ppVar10 >> 3;
    lVar8 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar8 == 0; lVar8 = lVar8 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,unsigned_int>*,std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<foxxll::stats_data::summary<unsigned_int>::summary<foxxll::stats_data::get_read_count_summary()const::__0>(std::vector<foxxll::file_stats_data,std::allocator<foxxll::file_stats_data>>const&,foxxll::stats_data::get_read_count_summary()const::__0_const&)::_lambda(std::pair<unsigned_int,unsigned_int>,std::pair<unsigned_int,unsigned_int>)_1_>>
              (ppVar10,ppVar2,((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)ppVar2 - (long)ppVar10 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,unsigned_int>*,std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<foxxll::stats_data::summary<unsigned_int>::summary<foxxll::stats_data::get_read_count_summary()const::__0>(std::vector<foxxll::file_stats_data,std::allocator<foxxll::file_stats_data>>const&,foxxll::stats_data::get_read_count_summary()const::__0_const&)::_lambda(std::pair<unsigned_int,unsigned_int>,std::pair<unsigned_int,unsigned_int>)_1_>>
                (ppVar10,ppVar2);
    }
    else {
      ppVar13 = ppVar10 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,unsigned_int>*,std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<foxxll::stats_data::summary<unsigned_int>::summary<foxxll::stats_data::get_read_count_summary()const::__0>(std::vector<foxxll::file_stats_data,std::allocator<foxxll::file_stats_data>>const&,foxxll::stats_data::get_read_count_summary()const::__0_const&)::_lambda(std::pair<unsigned_int,unsigned_int>,std::pair<unsigned_int,unsigned_int>)_1_>>
                (ppVar10,ppVar13);
      if (ppVar13 != ppVar2) {
        puVar15 = &ppVar10[0x10].second;
        do {
          pVar3 = *ppVar13;
          uVar11 = ppVar13[-1].first;
          uVar6 = pVar3.first;
          ppVar10 = ppVar13;
          puVar5 = puVar15;
          if (uVar6 < uVar11) {
            do {
              puVar9 = puVar5;
              ((pair<unsigned_int,_unsigned_int> *)(puVar9 + -1))->first = uVar11;
              uVar11 = puVar9[-5];
              *puVar9 = puVar9[-2];
              puVar5 = puVar9 + -2;
            } while (uVar6 < uVar11);
            ppVar10 = (pointer)(puVar9 + -3);
          }
          ppVar10->first = uVar6;
          ppVar10->second = pVar3.second;
          ppVar13 = ppVar13 + 1;
          puVar15 = puVar15 + 2;
        } while (ppVar13 != ppVar2);
      }
    }
  }
  ppVar10 = (__return_storage_ptr__->values_per_device).
            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (__return_storage_ptr__->values_per_device).
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar8 = (long)ppVar2 - (long)ppVar10;
  if ((long)ppVar2 - (long)ppVar10 == 0) {
    __return_storage_ptr__->max = 0;
    __return_storage_ptr__->total = 0;
    __return_storage_ptr__->min = 0;
    __return_storage_ptr__->average = 0.0;
    __return_storage_ptr__->median = 0.0;
  }
  else {
    uVar7 = lVar8 >> 3;
    __return_storage_ptr__->min = ppVar10->first;
    __return_storage_ptr__->max = ppVar2[-1].first;
    uVar12 = uVar7 >> 1;
    if (((long)ppVar2 - (long)ppVar10 & 8U) == 0) {
      dVar4 = (double)(ppVar10[uVar12].first + ppVar10[uVar12 - 1].first) * 0.5;
    }
    else {
      dVar4 = (double)ppVar10[uVar12].first;
    }
    __return_storage_ptr__->median = dVar4;
    uVar11 = 0;
    do {
      uVar11 = uVar11 + ppVar10->first;
      ppVar10 = ppVar10 + 1;
    } while (ppVar10 != ppVar2);
    auVar16._8_4_ = (int)(lVar8 >> 0x23);
    auVar16._0_8_ = uVar7;
    auVar16._12_4_ = 0x45300000;
    __return_storage_ptr__->total = uVar11;
    __return_storage_ptr__->average =
         (double)uVar11 /
         ((auVar16._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0));
  }
  return __return_storage_ptr__;
}

Assistant:

stats_data::summary<unsigned> stats_data::get_read_count_summary() const
{
    return {
               file_stats_data_list_, [](const file_stats_data& fsd) {
                   return fsd.get_read_count();
               }
    };
}